

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_transcode.cpp
# Opt level: O0

void __thiscall ktx::CommandTranscode::executeTranscode(CommandTranscode *this)

{
  string_view filepath;
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  ktxStream *pkVar5;
  ktxTexture2 **ppkVar6;
  ktxTexture2 *pkVar7;
  uint *puVar8;
  Reporter *this_00;
  size_t sVar9;
  undefined8 uVar10;
  char *pcVar11;
  ktxTexture2 *pkVar12;
  ulong uVar13;
  InputStream *this_01;
  long lVar14;
  long in_RDI;
  OutputStream outputFile;
  path outputPath;
  string writerScParams;
  string writer;
  ktx_error_code_e ret;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> ktx2Stream;
  KTXTexture2 texture;
  InputStream inputStream;
  string *in_stack_fffffffffffff888;
  path *in_stack_fffffffffffff890;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8ac;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *in_stack_fffffffffffff8b0;
  format fVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8b8;
  path *this_02;
  size_t in_stack_fffffffffffff8e0;
  char *in_stack_fffffffffffff8e8;
  char **in_stack_fffffffffffff8f0;
  size_t *psVar16;
  char (*in_stack_fffffffffffff8f8) [37];
  undefined8 in_stack_fffffffffffff900;
  ReturnCode RVar17;
  Reporter *in_stack_fffffffffffff908;
  Reporter *in_stack_fffffffffffff920;
  string *in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff930;
  int in_stack_fffffffffffff934;
  ktxTexture2 *in_stack_fffffffffffff938;
  undefined7 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  string *in_stack_fffffffffffff968;
  InputStream *in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  istream *in_stack_fffffffffffff980;
  path local_630;
  string local_608 [32];
  string local_5e8 [72];
  string local_5a0 [32];
  string local_580 [32];
  char *local_560;
  size_t local_558;
  string local_550 [24];
  undefined8 in_stack_fffffffffffffac8;
  OptionsTranscodeTarget<true> *in_stack_fffffffffffffad0;
  KTXTexture2 *in_stack_fffffffffffffad8;
  KTXTexture2 local_520;
  undefined8 local_518;
  int local_50c;
  format_args in_stack_fffffffffffffaf8;
  string_view in_stack_fffffffffffffb08;
  KTXTexture2 local_4e0;
  undefined1 local_4d8 [16];
  string local_4c8 [48];
  InputStream local_498;
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined1 *local_b0;
  char *local_a8;
  string *local_98;
  long local_90;
  char *local_88;
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char **local_68;
  char *local_60;
  char **local_58;
  undefined1 *local_50;
  undefined8 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined8 *local_28;
  char **local_20;
  char *local_18;
  char *local_8;
  
  RVar17 = (ReturnCode)((ulong)in_stack_fffffffffffff900 >> 0x20);
  InputStream::InputStream
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             (Reporter *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
  InputStream::operator_cast_to_istream_(&local_498);
  local_4d8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 200));
  filepath._M_str = in_stack_fffffffffffff8e8;
  filepath._M_len = in_stack_fffffffffffff8e0;
  fmtInFile_abi_cxx11_(filepath);
  validateToolInput(in_stack_fffffffffffff980,
                    (string *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                    (Reporter *)in_stack_fffffffffffff970);
  std::__cxx11::string::~string(local_4c8);
  KTXTexture2::KTXTexture2(&local_4e0,(nullptr_t)0x0);
  InputStream::operator->(&local_498);
  std::ios::rdbuf();
  std::operator|(_S_in,_S_bin);
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::StreambufStream
            (in_stack_fffffffffffff8b0,
             (basic_streambuf<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
             (openmode)((ulong)in_stack_fffffffffffff8a0 >> 0x20));
  pkVar5 = StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::stream
                     ((StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)
                      0x2a2c9a);
  ppkVar6 = KTXTexture2::pHandle(&local_4e0);
  local_50c = ktxTexture2_CreateFromStream(pkVar5,1,ppkVar6);
  if (local_50c != 0) {
    local_518 = ktxErrorString(local_50c);
    Reporter::fatal<char_const(&)[34],char_const*>
              (in_stack_fffffffffffff908,RVar17,(char (*) [34])in_stack_fffffffffffff8f8,
               in_stack_fffffffffffff8f0);
  }
  pkVar7 = KTXTexture2::operator_cast_to_ktxTexture2_(&local_4e0);
  bVar1 = ktxTexture2_NeedsTranscoding(pkVar7);
  if ((bVar1 & 1) == 0) {
    Reporter::fatal<char_const(&)[30]>
              (in_stack_fffffffffffff908,RVar17,(char (*) [30])in_stack_fffffffffffff8f8);
  }
  transcode<true>(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                  (Reporter *)in_stack_fffffffffffffac8);
  KTXTexture2::operator=(&local_4e0,&local_520);
  KTXTexture2::~KTXTexture2((KTXTexture2 *)in_stack_fffffffffffff890);
  bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x2a2e8c);
  if (bVar2) {
    in_stack_fffffffffffff938 = KTXTexture2::operator_cast_to_ktxTexture2_(&local_4e0);
    puVar8 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x2a2ec0);
    in_stack_fffffffffffff934 = ktxTexture2_DeflateZstd(in_stack_fffffffffffff938,*puVar8);
    local_50c = in_stack_fffffffffffff934;
    if (in_stack_fffffffffffff934 != 0) {
      in_stack_fffffffffffff920 = (Reporter *)(in_RDI + 8);
      in_stack_fffffffffffff928 = (string *)ktxErrorString(in_stack_fffffffffffff934);
      Reporter::fatal<char_const(&)[37],char_const*>
                (in_stack_fffffffffffff908,RVar17,in_stack_fffffffffffff8f8,
                 in_stack_fffffffffffff8f0);
    }
  }
  bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x2a2f94);
  if (bVar2) {
    pkVar7 = KTXTexture2::operator_cast_to_ktxTexture2_(&local_4e0);
    puVar8 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x2a2fc8);
    local_50c = ktxTexture2_DeflateZLIB(pkVar7,*puVar8);
    if (local_50c != 0) {
      RVar17 = (ReturnCode)((ulong)(in_RDI + 8) >> 0x20);
      this_00 = (Reporter *)ktxErrorString(local_50c);
      Reporter::fatal<char_const(&)[37],char_const*>
                (this_00,RVar17,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    }
  }
  local_68 = &local_560;
  local_70 = "{} {}";
  local_60 = "{} {}";
  local_560 = "{} {}";
  psVar16 = &local_558;
  local_58 = local_68;
  sVar9 = std::char_traits<char>::length((char_type *)0x2a30bb);
  *psVar16 = sVar9;
  local_8 = local_70;
  lVar14 = in_RDI + 8;
  version_abi_cxx11_(SUB81((ulong)in_stack_fffffffffffff8b8 >> 0x38,0));
  local_78 = local_550;
  local_88 = local_560;
  sStack_80 = local_558;
  local_98 = local_580;
  local_20 = &local_88;
  local_a8 = local_560;
  local_90 = lVar14;
  local_18 = local_a8;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff8b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8b0);
  fVar15 = (format)((ulong)in_stack_fffffffffffff8b0 >> 0x38);
  local_48 = &local_b8;
  local_50 = local_d8;
  local_30 = 0xdd;
  local_b8 = 0xdd;
  local_40 = local_50;
  local_38 = local_50;
  local_28 = local_48;
  local_b0 = local_50;
  ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffb08,in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_580);
  pkVar7 = KTXTexture2::operator->(&local_4e0);
  ktxHashList_DeleteKVPair(&pkVar7->kvDataHead,"KTXwriter");
  pkVar7 = KTXTexture2::operator->(&local_4e0);
  this_02 = (path *)local_550;
  iVar3 = std::__cxx11::string::size();
  uVar10 = std::__cxx11::string::c_str();
  ktxHashList_AddKVPair(&pkVar7->kvDataHead,"KTXwriter",iVar3 + 1,uVar10);
  std::__cxx11::string::string(local_5a0,(string *)(in_RDI + 0x98));
  pkVar7 = KTXTexture2::operator->(&local_4e0);
  ktxHashList_DeleteKVPair(&pkVar7->kvDataHead,"KTXwriterScParams");
  lVar14 = std::__cxx11::string::size();
  if (lVar14 != 0) {
    pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_5a0);
    if (*pcVar11 != ' ') {
      __assert_fail("writerScParams[0] == \' \'",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_transcode.cpp"
                    ,0xb4,"void ktx::CommandTranscode::executeTranscode()");
    }
    pkVar12 = KTXTexture2::operator->(&local_4e0);
    in_stack_fffffffffffff8a0 =
         (StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)
         &pkVar12->kvDataHead;
    uVar4 = std::__cxx11::string::size();
    fVar15 = (format)((ulong)pkVar12 >> 0x38);
    lVar14 = std::__cxx11::string::c_str();
    ktxHashList_AddKVPair(in_stack_fffffffffffff8a0,"KTXwriterScParams",uVar4,lVar14 + 1);
  }
  std::__cxx11::string::string(local_608,(string *)(in_RDI + 0xe8));
  DecodeUTF8Path(in_stack_fffffffffffff888);
  std::filesystem::__cxx11::path::path(this_02,(string_type *)pkVar7,fVar15);
  std::__cxx11::string::~string(local_5e8);
  std::__cxx11::string::~string(local_608);
  uVar13 = std::filesystem::__cxx11::path::has_parent_path();
  if ((uVar13 & 1) != 0) {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::create_directories(&local_630);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffff890);
  }
  OutputStream::OutputStream
            ((OutputStream *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             in_stack_fffffffffffff928,in_stack_fffffffffffff920);
  this_01 = (InputStream *)KTXTexture2::operator_cast_to_ktxTexture_(&local_4e0);
  OutputStream::writeKTX2
            ((OutputStream *)CONCAT17(bVar1,in_stack_fffffffffffff940),
             (ktxTexture *)in_stack_fffffffffffff938,
             (Reporter *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
  OutputStream::~OutputStream((OutputStream *)this_01);
  std::filesystem::__cxx11::path::~path((path *)this_01);
  std::__cxx11::string::~string(local_5a0);
  std::__cxx11::string::~string(local_550);
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
            (in_stack_fffffffffffff8a0);
  KTXTexture2::~KTXTexture2((KTXTexture2 *)this_01);
  InputStream::~InputStream(this_01);
  return;
}

Assistant:

void CommandTranscode::executeTranscode() {
    InputStream inputStream(options.inputFilepath, *this);
    validateToolInput(inputStream, fmtInFile(options.inputFilepath), *this);

    KTXTexture2 texture{nullptr};
    StreambufStream<std::streambuf*> ktx2Stream{inputStream->rdbuf(), std::ios::in | std::ios::binary};
    auto ret = ktxTexture2_CreateFromStream(ktx2Stream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture.pHandle());
    if (ret != KTX_SUCCESS)
        fatal(rc::INVALID_FILE, "Failed to create KTX2 texture: {}", ktxErrorString(ret));

    if (!ktxTexture2_NeedsTranscoding(texture))
        fatal(rc::INVALID_FILE, "KTX file is not transcodable.");

    texture = transcode(std::move(texture), options, *this);

    if (options.zstd) {
        ret = ktxTexture2_DeflateZstd(texture, *options.zstd);
        if (ret != KTX_SUCCESS)
            fatal(rc::KTX_FAILURE, "Zstd deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    if (options.zlib) {
        ret = ktxTexture2_DeflateZLIB(texture, *options.zlib);
        if (ret != KTX_SUCCESS)
            fatal(rc::KTX_FAILURE, "ZLIB deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    // Modify KTXwriter metadata
    const auto writer = fmt::format("{} {}", commandName, version(options.testrun));
    ktxHashList_DeleteKVPair(&texture->kvDataHead, KTX_WRITER_KEY);
    ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
            static_cast<uint32_t>(writer.size() + 1), // +1 to include the \0
            writer.c_str());

    // Add KTXwriterScParams metadata if supercompression was used
    const auto writerScParams = options.compressOptions;
    ktxHashList_DeleteKVPair(&texture->kvDataHead, KTX_WRITER_SCPARAMS_KEY);
    if (writerScParams.size() > 0) {
        // Options always contain a leading space
        assert(writerScParams[0] == ' ');
        ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_SCPARAMS_KEY,
            static_cast<uint32_t>(writerScParams.size()),
            writerScParams.c_str() + 1); // +1 to exclude leading space
    }

    // Save output file
    const auto outputPath = std::filesystem::path(DecodeUTF8Path(options.outputFilepath));
    if (outputPath.has_parent_path())
        std::filesystem::create_directories(outputPath.parent_path());

    OutputStream outputFile(options.outputFilepath, *this);
    outputFile.writeKTX2(texture, *this);
}